

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void jpgd::DCT_Upsample::R_S<7,_7>::calc(Matrix44 *R,Matrix44 *S,jpgd_block_t *pSrc)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  Element_Type *pEVar45;
  Temp_Type X137;
  Temp_Type X136;
  Temp_Type X135;
  Temp_Type X134;
  Temp_Type X133;
  Temp_Type X132;
  Temp_Type X131;
  Temp_Type X130;
  Temp_Type X127;
  Temp_Type X126;
  Temp_Type X125;
  Temp_Type X124;
  Temp_Type X123;
  Temp_Type X122;
  Temp_Type X121;
  Temp_Type X120;
  Temp_Type X117;
  Temp_Type X116;
  Temp_Type X115;
  Temp_Type X114;
  Temp_Type X113;
  Temp_Type X112;
  Temp_Type X111;
  Temp_Type X110;
  Temp_Type X107;
  Temp_Type X106;
  Temp_Type X105;
  Temp_Type X104;
  Temp_Type X103;
  Temp_Type X102;
  Temp_Type X101;
  Temp_Type X100;
  jpgd_block_t *pSrc_local;
  Matrix44 *S_local;
  Matrix44 *R_local;
  
  sVar1 = pSrc[1];
  sVar2 = pSrc[3];
  sVar3 = pSrc[5];
  iVar33 = pSrc[9] * 0x3a0 + pSrc[0xb] * -0x145 + pSrc[0xd] * 0xda + 0x200 >> 10;
  sVar4 = pSrc[0x11];
  sVar5 = pSrc[0x13];
  sVar6 = pSrc[0x15];
  iVar34 = pSrc[0x19] * 0x3a0 + pSrc[0x1b] * -0x145 + pSrc[0x1d] * 0xda + 0x200 >> 10;
  sVar7 = pSrc[0x21];
  sVar8 = pSrc[0x23];
  sVar9 = pSrc[0x25];
  iVar35 = pSrc[0x29] * 0x3a0 + pSrc[0x2b] * -0x145 + pSrc[0x2d] * 0xda + 0x200 >> 10;
  sVar10 = pSrc[0x31];
  sVar11 = pSrc[0x33];
  sVar12 = pSrc[0x35];
  sVar13 = pSrc[2];
  iVar36 = (int)pSrc[10];
  sVar14 = pSrc[0x12];
  iVar37 = (int)pSrc[0x1a];
  sVar15 = pSrc[0x22];
  iVar38 = (int)pSrc[0x2a];
  sVar16 = pSrc[0x32];
  sVar17 = pSrc[1];
  sVar18 = pSrc[3];
  sVar19 = pSrc[5];
  iVar39 = pSrc[9] * -0x4b + pSrc[0xb] * 0x20e + pSrc[0xd] * 0x313 + 0x200 >> 10;
  sVar20 = pSrc[0x11];
  sVar21 = pSrc[0x13];
  sVar22 = pSrc[0x15];
  iVar40 = pSrc[0x19] * -0x4b + pSrc[0x1b] * 0x20e + pSrc[0x1d] * 0x313 + 0x200 >> 10;
  sVar23 = pSrc[0x21];
  sVar24 = pSrc[0x23];
  sVar25 = pSrc[0x25];
  iVar41 = pSrc[0x29] * -0x4b + pSrc[0x2b] * 0x20e + pSrc[0x2d] * 0x313 + 0x200 >> 10;
  sVar26 = pSrc[0x31];
  sVar27 = pSrc[0x33];
  sVar28 = pSrc[0x35];
  sVar29 = pSrc[6];
  iVar42 = (int)pSrc[0xe];
  sVar30 = pSrc[0x16];
  iVar43 = (int)pSrc[0x1e];
  sVar31 = pSrc[0x26];
  iVar44 = (int)pSrc[0x2e];
  sVar32 = pSrc[0x36];
  pEVar45 = Matrix44::at(R,0,0);
  *pEVar45 = sVar1 * 0x3a0 + sVar2 * -0x145 + sVar3 * 0xda + 0x200 >> 10;
  pEVar45 = Matrix44::at(R,0,1);
  *pEVar45 = iVar33 * 0x1aa + iVar34 * 0x32a + iVar35 * -0x168 + 0x200 >> 10;
  pEVar45 = Matrix44::at(R,0,2);
  *pEVar45 = sVar7 * 0x3a0 + sVar8 * -0x145 + sVar9 * 0xda + 0x200 >> 10;
  pEVar45 = Matrix44::at(R,0,3);
  *pEVar45 = iVar33 * 0x17 + iVar34 * -99 + iVar35 * 0x1f6 + 0x200 >> 10;
  pEVar45 = Matrix44::at(R,1,0);
  *pEVar45 = (int)sVar13;
  pEVar45 = Matrix44::at(R,1,1);
  *pEVar45 = iVar36 * 0x1aa + iVar37 * 0x32a + iVar38 * -0x168 + 0x200 >> 10;
  pEVar45 = Matrix44::at(R,1,2);
  *pEVar45 = (int)sVar15;
  pEVar45 = Matrix44::at(R,1,3);
  *pEVar45 = iVar36 * 0x17 + iVar37 * -99 + iVar38 * 0x1f6 + 0x200 >> 10;
  pEVar45 = Matrix44::at(R,2,0);
  *pEVar45 = sVar17 * -0x4b + sVar18 * 0x20e + sVar19 * 0x313 + 0x200 >> 10;
  pEVar45 = Matrix44::at(R,2,1);
  *pEVar45 = iVar39 * 0x1aa + iVar40 * 0x32a + iVar41 * -0x168 + 0x200 >> 10;
  pEVar45 = Matrix44::at(R,2,2);
  *pEVar45 = sVar23 * -0x4b + sVar24 * 0x20e + sVar25 * 0x313 + 0x200 >> 10;
  pEVar45 = Matrix44::at(R,2,3);
  *pEVar45 = iVar39 * 0x17 + iVar40 * -99 + iVar41 * 0x1f6 + 0x200 >> 10;
  pEVar45 = Matrix44::at(R,3,0);
  *pEVar45 = (int)sVar29;
  pEVar45 = Matrix44::at(R,3,1);
  *pEVar45 = iVar42 * 0x1aa + iVar43 * 0x32a + iVar44 * -0x168 + 0x200 >> 10;
  pEVar45 = Matrix44::at(R,3,2);
  *pEVar45 = (int)sVar31;
  pEVar45 = Matrix44::at(R,3,3);
  *pEVar45 = iVar42 * 0x17 + iVar43 * -99 + iVar44 * 0x1f6 + 0x200 >> 10;
  pEVar45 = Matrix44::at(S,0,0);
  *pEVar45 = iVar33 * 0x3a0 + iVar34 * -0x145 + iVar35 * 0xda + 0x200 >> 10;
  pEVar45 = Matrix44::at(S,0,1);
  *pEVar45 = sVar4 * 0x3a0 + sVar5 * -0x145 + sVar6 * 0xda + 0x200 >> 10;
  pEVar45 = Matrix44::at(S,0,2);
  *pEVar45 = iVar33 * -0x4b + iVar34 * 0x20e + iVar35 * 0x313 + 0x200 >> 10;
  pEVar45 = Matrix44::at(S,0,3);
  *pEVar45 = sVar10 * 0x3a0 + sVar11 * -0x145 + sVar12 * 0xda + 0x200 >> 10;
  pEVar45 = Matrix44::at(S,1,0);
  *pEVar45 = iVar36 * 0x3a0 + iVar37 * -0x145 + iVar38 * 0xda + 0x200 >> 10;
  pEVar45 = Matrix44::at(S,1,1);
  *pEVar45 = (int)sVar14;
  pEVar45 = Matrix44::at(S,1,2);
  *pEVar45 = iVar36 * -0x4b + iVar37 * 0x20e + iVar38 * 0x313 + 0x200 >> 10;
  pEVar45 = Matrix44::at(S,1,3);
  *pEVar45 = (int)sVar16;
  pEVar45 = Matrix44::at(S,2,0);
  *pEVar45 = iVar39 * 0x3a0 + iVar40 * -0x145 + iVar41 * 0xda + 0x200 >> 10;
  pEVar45 = Matrix44::at(S,2,1);
  *pEVar45 = sVar20 * -0x4b + sVar21 * 0x20e + sVar22 * 0x313 + 0x200 >> 10;
  pEVar45 = Matrix44::at(S,2,2);
  *pEVar45 = iVar39 * -0x4b + iVar40 * 0x20e + iVar41 * 0x313 + 0x200 >> 10;
  pEVar45 = Matrix44::at(S,2,3);
  *pEVar45 = sVar26 * -0x4b + sVar27 * 0x20e + sVar28 * 0x313 + 0x200 >> 10;
  pEVar45 = Matrix44::at(S,3,0);
  *pEVar45 = iVar42 * 0x3a0 + iVar43 * -0x145 + iVar44 * 0xda + 0x200 >> 10;
  pEVar45 = Matrix44::at(S,3,1);
  *pEVar45 = (int)sVar30;
  pEVar45 = Matrix44::at(S,3,2);
  *pEVar45 = iVar42 * -0x4b + iVar43 * 0x20e + iVar44 * 0x313 + 0x200 >> 10;
  pEVar45 = Matrix44::at(S,3,3);
  *pEVar45 = (int)sVar32;
  return;
}

Assistant:

static void calc(Matrix44& R, Matrix44& S, const jpgd_block_t* pSrc)
    {
      // 4x8 = 4x8 times 8x8, matrix 0 is constant
      const Temp_Type X100 = D(F(0.906127f) * AT(1, 0) + F(-0.318190f) * AT(3, 0) + F(0.212608f) * AT(5, 0) + F(-0.180240f) * AT(7, 0));
      const Temp_Type X101 = D(F(0.906127f) * AT(1, 1) + F(-0.318190f) * AT(3, 1) + F(0.212608f) * AT(5, 1) + F(-0.180240f) * AT(7, 1));
      const Temp_Type X102 = D(F(0.906127f) * AT(1, 2) + F(-0.318190f) * AT(3, 2) + F(0.212608f) * AT(5, 2) + F(-0.180240f) * AT(7, 2));
      const Temp_Type X103 = D(F(0.906127f) * AT(1, 3) + F(-0.318190f) * AT(3, 3) + F(0.212608f) * AT(5, 3) + F(-0.180240f) * AT(7, 3));
      const Temp_Type X104 = D(F(0.906127f) * AT(1, 4) + F(-0.318190f) * AT(3, 4) + F(0.212608f) * AT(5, 4) + F(-0.180240f) * AT(7, 4));
      const Temp_Type X105 = D(F(0.906127f) * AT(1, 5) + F(-0.318190f) * AT(3, 5) + F(0.212608f) * AT(5, 5) + F(-0.180240f) * AT(7, 5));
      const Temp_Type X106 = D(F(0.906127f) * AT(1, 6) + F(-0.318190f) * AT(3, 6) + F(0.212608f) * AT(5, 6) + F(-0.180240f) * AT(7, 6));
      const Temp_Type X107 = D(F(0.906127f) * AT(1, 7) + F(-0.318190f) * AT(3, 7) + F(0.212608f) * AT(5, 7) + F(-0.180240f) * AT(7, 7));
      const Temp_Type X110 = AT(2, 0);
      const Temp_Type X111 = AT(2, 1);
      const Temp_Type X112 = AT(2, 2);
      const Temp_Type X113 = AT(2, 3);
      const Temp_Type X114 = AT(2, 4);
      const Temp_Type X115 = AT(2, 5);
      const Temp_Type X116 = AT(2, 6);
      const Temp_Type X117 = AT(2, 7);
      const Temp_Type X120 = D(F(-0.074658f) * AT(1, 0) + F(0.513280f) * AT(3, 0) + F(0.768178f) * AT(5, 0) + F(-0.375330f) * AT(7, 0));
      const Temp_Type X121 = D(F(-0.074658f) * AT(1, 1) + F(0.513280f) * AT(3, 1) + F(0.768178f) * AT(5, 1) + F(-0.375330f) * AT(7, 1));
      const Temp_Type X122 = D(F(-0.074658f) * AT(1, 2) + F(0.513280f) * AT(3, 2) + F(0.768178f) * AT(5, 2) + F(-0.375330f) * AT(7, 2));
      const Temp_Type X123 = D(F(-0.074658f) * AT(1, 3) + F(0.513280f) * AT(3, 3) + F(0.768178f) * AT(5, 3) + F(-0.375330f) * AT(7, 3));
      const Temp_Type X124 = D(F(-0.074658f) * AT(1, 4) + F(0.513280f) * AT(3, 4) + F(0.768178f) * AT(5, 4) + F(-0.375330f) * AT(7, 4));
      const Temp_Type X125 = D(F(-0.074658f) * AT(1, 5) + F(0.513280f) * AT(3, 5) + F(0.768178f) * AT(5, 5) + F(-0.375330f) * AT(7, 5));
      const Temp_Type X126 = D(F(-0.074658f) * AT(1, 6) + F(0.513280f) * AT(3, 6) + F(0.768178f) * AT(5, 6) + F(-0.375330f) * AT(7, 6));
      const Temp_Type X127 = D(F(-0.074658f) * AT(1, 7) + F(0.513280f) * AT(3, 7) + F(0.768178f) * AT(5, 7) + F(-0.375330f) * AT(7, 7));
      const Temp_Type X130 = AT(6, 0);
      const Temp_Type X131 = AT(6, 1);
      const Temp_Type X132 = AT(6, 2);
      const Temp_Type X133 = AT(6, 3);
      const Temp_Type X134 = AT(6, 4);
      const Temp_Type X135 = AT(6, 5);
      const Temp_Type X136 = AT(6, 6);
      const Temp_Type X137 = AT(6, 7);
      // 80 muls 48 adds

      // 4x4 = 4x8 times 8x4, matrix 1 is constant
      R.at(0, 0) = X100;
      R.at(0, 1) = D(X101 * F(0.415735f) + X103 * F(0.791065f) + X105 * F(-0.352443f) + X107 * F(0.277785f));
      R.at(0, 2) = X104;
      R.at(0, 3) = D(X101 * F(0.022887f) + X103 * F(-0.097545f) + X105 * F(0.490393f) + X107 * F(0.865723f));
      R.at(1, 0) = X110;
      R.at(1, 1) = D(X111 * F(0.415735f) + X113 * F(0.791065f) + X115 * F(-0.352443f) + X117 * F(0.277785f));
      R.at(1, 2) = X114;
      R.at(1, 3) = D(X111 * F(0.022887f) + X113 * F(-0.097545f) + X115 * F(0.490393f) + X117 * F(0.865723f));
      R.at(2, 0) = X120;
      R.at(2, 1) = D(X121 * F(0.415735f) + X123 * F(0.791065f) + X125 * F(-0.352443f) + X127 * F(0.277785f));
      R.at(2, 2) = X124;
      R.at(2, 3) = D(X121 * F(0.022887f) + X123 * F(-0.097545f) + X125 * F(0.490393f) + X127 * F(0.865723f));
      R.at(3, 0) = X130;
      R.at(3, 1) = D(X131 * F(0.415735f) + X133 * F(0.791065f) + X135 * F(-0.352443f) + X137 * F(0.277785f));
      R.at(3, 2) = X134;
      R.at(3, 3) = D(X131 * F(0.022887f) + X133 * F(-0.097545f) + X135 * F(0.490393f) + X137 * F(0.865723f));
      // 40 muls 24 adds
      // 4x4 = 4x8 times 8x4, matrix 1 is constant
      S.at(0, 0) = D(X101 * F(0.906127f) + X103 * F(-0.318190f) + X105 * F(0.212608f) + X107 * F(-0.180240f));
      S.at(0, 1) = X102;
      S.at(0, 2) = D(X101 * F(-0.074658f) + X103 * F(0.513280f) + X105 * F(0.768178f) + X107 * F(-0.375330f));
      S.at(0, 3) = X106;
      S.at(1, 0) = D(X111 * F(0.906127f) + X113 * F(-0.318190f) + X115 * F(0.212608f) + X117 * F(-0.180240f));
      S.at(1, 1) = X112;
      S.at(1, 2) = D(X111 * F(-0.074658f) + X113 * F(0.513280f) + X115 * F(0.768178f) + X117 * F(-0.375330f));
      S.at(1, 3) = X116;
      S.at(2, 0) = D(X121 * F(0.906127f) + X123 * F(-0.318190f) + X125 * F(0.212608f) + X127 * F(-0.180240f));
      S.at(2, 1) = X122;
      S.at(2, 2) = D(X121 * F(-0.074658f) + X123 * F(0.513280f) + X125 * F(0.768178f) + X127 * F(-0.375330f));
      S.at(2, 3) = X126;
      S.at(3, 0) = D(X131 * F(0.906127f) + X133 * F(-0.318190f) + X135 * F(0.212608f) + X137 * F(-0.180240f));
      S.at(3, 1) = X132;
      S.at(3, 2) = D(X131 * F(-0.074658f) + X133 * F(0.513280f) + X135 * F(0.768178f) + X137 * F(-0.375330f));
      S.at(3, 3) = X136;
      // 40 muls 24 adds
    }